

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupColVals(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  bool bVar1;
  type_conflict5 tVar2;
  double val_00;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  int len;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *val;
  int *idx;
  int k;
  int n;
  int i;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffda8;
  cpp_dec_float<50U,_int,_void> *v;
  cpp_dec_float<50U,_int,_void> *this_00;
  undefined1 local_234 [4];
  value_type *in_stack_fffffffffffffdd0;
  size_type in_stack_fffffffffffffdd8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_stack_fffffffffffffde0;
  const_iterator in_stack_fffffffffffffde8;
  undefined1 local_1fc [56];
  undefined1 local_1c4 [112];
  int local_154;
  cpp_dec_float<50U,_int,_void> *local_150;
  int *local_148;
  int local_13c;
  undefined8 local_138;
  undefined1 local_130 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined4 local_ec;
  undefined1 local_e8 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  int local_a0;
  int local_9c;
  undefined8 local_90;
  undefined8 *local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined4 *local_70;
  undefined1 *local_68;
  cpp_dec_float<50U,_int,_void> *local_60;
  undefined1 *local_58;
  cpp_dec_float<50U,_int,_void> *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  uint *local_38;
  undefined1 *local_30;
  uint *local_28;
  cpp_dec_float<50U,_int,_void> *local_20;
  reference local_18;
  undefined4 *local_10;
  undefined8 *local_8;
  
  local_a0 = *(int *)((long)&(((_Vector_impl *)(in_RDI->data)._M_elems)->super__Vector_impl_data).
                             _M_start + 4);
  bVar1 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::empty((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   *)in_RDI);
  if (!bVar1) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::clear((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)0x352b47);
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reserve(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  this_00 = (cpp_dec_float<50U,_int,_void> *)((long)in_RDI[0xb].data._M_elems + 0x10);
  local_b0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)std::
                vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ::begin((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         *)in_stack_fffffffffffffda8);
  __gnu_cxx::
  __normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>const*,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>>>
  ::
  __normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>*>
            ((__normal_iterator<const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
              *)this_00,
             (__normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
              *)in_stack_fffffffffffffda8);
  val_00 = (double)(long)(int)in_RDI[0xb].data._M_elems[0];
  local_ec = 0;
  local_68 = local_e8;
  local_70 = &local_ec;
  local_78 = 0;
  local_10 = local_70;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (in_RDI,(longlong)val_00,this_00);
  local_f8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)std::
                vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ::insert(in_stack_fffffffffffffde0,in_stack_fffffffffffffde8,
                         in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  for (local_9c = 0; local_9c < (int)(in_RDI->data)._M_elems[1]; local_9c = local_9c + 1) {
    *(undefined4 *)(*(long *)&in_RDI[0xb].fpclass + (long)local_9c * 4) = 0;
  }
  local_138 = 0;
  local_80 = local_130;
  local_88 = &local_138;
  local_90 = 0;
  local_8 = local_88;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_RDI,val_00,this_00);
  local_28 = in_RDI[1].data._M_elems + 3;
  local_30 = local_130;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (this_00,in_stack_fffffffffffffda8);
  for (local_9c = 0; local_9c < (int)(in_RDI->data)._M_elems[1]; local_9c = local_9c + 1) {
    local_13c = *(int *)(*(long *)in_RDI[10].data._M_elems + (long)local_9c * 4);
    local_148 = (int *)(*(long *)&in_RDI[9].fpclass + (long)local_13c * 4);
    local_150 = &std::
                 vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               *)(in_RDI[9].data._M_elems + 6),(long)local_13c)->m_backend;
    local_154 = *(int *)(*(long *)(in_RDI[10].data._M_elems + 2) + (long)local_9c * 4);
    local_a0 = local_154 + local_a0;
    while (0 < local_154) {
      local_13c = *(int *)(*(long *)&in_RDI[0xb].exp + (long)*local_148 * 4) +
                  *(int *)(*(long *)&in_RDI[0xb].fpclass + (long)*local_148 * 4);
      *(int *)(*(long *)&in_RDI[0xb].fpclass + (long)*local_148 * 4) =
           *(int *)(*(long *)&in_RDI[0xb].fpclass + (long)*local_148 * 4) + 1;
      *(int *)(*(long *)(in_RDI[0xb].data._M_elems + 2) + (long)local_13c * 4) = local_9c;
      v = local_150;
      local_154 = local_154 + -1;
      local_18 = std::
                 vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               *)(in_RDI[0xb].data._M_elems + 4),(long)local_13c);
      local_20 = v;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,v);
      local_58 = local_1c4;
      local_60 = local_150;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,v);
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)v);
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)v,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)0x352f22);
      if (tVar2) {
        local_48 = local_234;
        local_50 = local_150;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,v);
        spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)v);
        local_38 = in_RDI[1].data._M_elems + 3;
        local_40 = local_1fc;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,v);
      }
      local_148 = local_148 + 1;
      local_150 = local_150 + 1;
    }
    local_154 = local_154 + -1;
  }
  return local_a0;
}

Assistant:

int CLUFactor<R>::setupColVals()
{
   int i;
   int n = thedim;

   if(!u.col.val.empty())
      u.col.val.clear();

   u.col.val.reserve(u.col.size); // small performance improvement before the insertion
   u.col.val.insert(u.col.val.begin(), u.col.size, 0);

   for(i = 0; i < thedim; i++)
      u.col.len[i] = 0;

   maxabs = R(0.0);

   for(i = 0; i < thedim; i++)
   {
      int     k   = u.row.start[i];
      int*    idx = &u.row.idx[k];
      R*   val = &u.row.val[k];
      int     len = u.row.len[i];

      n += len;

      while(len-- > 0)
      {
         assert((*idx >= 0) && (*idx < thedim));

         k = u.col.start[*idx] + u.col.len[*idx];

         assert((k >= 0) && (k < u.col.size));

         u.col.len[*idx]++;

         assert(u.col.len[*idx] <= u.col.max[*idx]);

         u.col.idx[k] = i;
         u.col.val[k] = *val;

         if(spxAbs(*val) > maxabs)
            maxabs = spxAbs(*val);

         idx++;

         val++;
      }
   }

   return n;
}